

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_avx2.c
# Opt level: O0

void aom_lpf_horizontal_14_quad_avx2(uchar *s,int p,uchar *_blimit0,uchar *_limit0,uchar *_thresh0)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined8 *puVar81;
  ulong *puVar82;
  undefined1 *in_RCX;
  undefined1 *in_RDX;
  int in_ESI;
  ulong *in_RDI;
  undefined1 *in_R8;
  __m256i flat2_p5q5;
  __m256i flat2_p4q4;
  __m256i flat2_p3q3;
  __m256i flat2_p2q2;
  __m256i flat2_p1q1;
  __m256i flat2_p0q0;
  __m256i pixelFilter_q;
  __m256i pixelFilter_p;
  __m256i flat_p2q2;
  __m256i p1q1256;
  __m256i flat_p1q1;
  __m256i sum_q;
  __m256i sum_p;
  __m256i flat_p0q0;
  __m256i res_q;
  __m256i res_p;
  __m256i pixetFilter_q2q1q0;
  __m256i pixetFilter_p2p1p0;
  __m256i q2q1q0;
  __m256i p2p1p0;
  __m256i filter;
  __m128i flat2;
  __m256i flat2_256;
  __m256i work3;
  __m256i work2;
  __m256i work1;
  __m256i p6q6256;
  __m256i p5q5256;
  __m256i p4q4256;
  __m256i q256_6;
  __m256i p256_6;
  __m256i q256_5;
  __m256i p256_5;
  __m256i q256_4;
  __m256i p256_4;
  __m256i four;
  __m256i eight;
  __m256i flat256;
  __m128i max1_256;
  __m256i max0_256;
  __m256i work02;
  __m256i work01;
  __m256i ps1qs1256;
  __m256i ps0qs0256;
  __m256i p3q3256;
  __m256i p2q2256;
  __m256i p0q0256;
  __m128i filter2;
  __m128i filter1;
  __m128i work_a;
  __m128i filt;
  __m128i qs1;
  __m128i qs0;
  __m128i ps0;
  __m128i ps1;
  __m128i hev;
  __m128i t7f;
  __m128i t1f;
  __m128i te0;
  __m128i t80;
  __m128i t4;
  __m128i t3;
  __m128i one;
  __m128i thresh_v;
  __m128i work;
  __m128i abs_p1q1;
  __m128i abs_p0q0;
  __m128i abs_q1q0;
  __m128i abs_p1p0;
  __m128i fe;
  __m128i blimit_v;
  __m128i limit_v;
  __m128i q3;
  __m128i q2;
  __m128i q1;
  __m128i q0;
  __m128i p0;
  __m128i p1;
  __m128i p2;
  __m128i p3;
  __m256i q256_3;
  __m256i q256_2;
  __m256i q256_1;
  __m256i q256_0;
  __m256i p256_0;
  __m256i p256_1;
  __m256i p256_2;
  __m256i p256_3;
  __m128i ff;
  __m128i zero;
  __m128i flat;
  __m128i mask;
  undefined8 local_48a0;
  undefined8 uStack_4898;
  undefined8 uStack_4890;
  undefined8 uStack_4888;
  undefined8 local_47a0;
  undefined8 local_4710;
  undefined8 uStack_4708;
  undefined8 local_4660;
  undefined8 uStack_4658;
  undefined8 uStack_4650;
  undefined8 uStack_4648;
  undefined8 local_4640;
  undefined8 uStack_4638;
  undefined8 uStack_4630;
  undefined8 uStack_4628;
  undefined1 local_4620 [32];
  undefined1 local_4600 [32];
  undefined1 local_45e0 [32];
  undefined1 local_45c0 [32];
  undefined1 local_45a0 [32];
  undefined1 local_4580 [32];
  undefined8 local_4440;
  undefined8 uStack_4438;
  undefined8 uStack_4430;
  undefined8 uStack_4428;
  undefined8 local_4420;
  undefined8 uStack_4418;
  undefined8 uStack_4410;
  undefined8 uStack_4408;
  undefined8 local_4400;
  undefined8 uStack_43f8;
  ulong uStack_43f0;
  ulong uStack_43e8;
  undefined1 local_41c0 [32];
  undefined1 local_41a0 [32];
  undefined1 local_4160 [16];
  ulong uStack_4150;
  ulong *puStack_4148;
  undefined1 local_4140 [32];
  undefined1 local_4100 [32];
  undefined1 local_40e0 [32];
  ulong local_40b0;
  ulong uStack_40a8;
  undefined8 local_4090;
  undefined8 uStack_4088;
  undefined8 uStack_3cb0;
  undefined8 uStack_3c90;
  undefined8 uStack_3c70;
  undefined8 uStack_3c50;
  undefined8 uStack_3c30;
  undefined8 uStack_3c10;
  undefined8 uStack_3bf0;
  undefined8 uStack_3bd0;
  ulong uStack_3bb0;
  ulong uStack_3b90;
  ulong uStack_3b70;
  ulong uStack_3b50;
  undefined8 uStack_3b30;
  undefined8 uStack_3b10;
  ulong local_3130;
  ulong uStack_3128;
  ulong local_3110;
  ulong uStack_3108;
  ulong local_30f0;
  ulong uStack_30e8;
  ulong local_30d0;
  ulong uStack_30c8;
  ulong local_3030;
  ulong uStack_3028;
  ulong local_3010;
  ulong uStack_3008;
  ulong local_120;
  ulong uStack_118;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  auVar3 = vpcmpeqb_avx(ZEXT816(0),ZEXT816(0));
  local_40e0._8_8_ = (long)in_RDI - (long)(in_ESI << 2);
  local_40e0._0_8_ = uStack_3b10;
  local_40e0._16_8_ = uStack_3b10;
  local_40e0._24_8_ = local_40e0._8_8_;
  local_4100._8_8_ = (long)in_RDI - (long)(in_ESI * 3);
  local_4100._0_8_ = uStack_3b30;
  local_4100._16_8_ = uStack_3b30;
  local_4100._24_8_ = local_4100._8_8_;
  local_4140._8_8_ = (long)in_RDI - (long)in_ESI;
  local_4140._0_8_ = uStack_3b70;
  local_4140._16_8_ = uStack_3b70;
  local_4140._24_8_ = local_4140._8_8_;
  local_4160._8_8_ = in_RDI;
  local_4160._0_8_ = uStack_3b90;
  uStack_4150 = uStack_3b90;
  puStack_4148 = in_RDI;
  local_41a0._8_8_ = (long)in_RDI + (long)(in_ESI * 2);
  local_41a0._0_8_ = uStack_3bd0;
  local_41a0._16_8_ = uStack_3bd0;
  local_41a0._24_8_ = local_41a0._8_8_;
  local_41c0._8_8_ = (long)in_RDI + (long)(in_ESI * 3);
  local_41c0._0_8_ = uStack_3bf0;
  local_41c0._16_8_ = uStack_3bf0;
  local_41c0._24_8_ = local_41c0._8_8_;
  uVar1 = *in_RCX;
  uVar2 = *in_RDX;
  auVar4 = vpinsrb_avx(ZEXT116(0xfe),0xfe,1);
  auVar4 = vpinsrb_avx(auVar4,0xfe,2);
  auVar4 = vpinsrb_avx(auVar4,0xfe,3);
  auVar4 = vpinsrb_avx(auVar4,0xfe,4);
  auVar4 = vpinsrb_avx(auVar4,0xfe,5);
  auVar4 = vpinsrb_avx(auVar4,0xfe,6);
  auVar4 = vpinsrb_avx(auVar4,0xfe,7);
  auVar4 = vpinsrb_avx(auVar4,0xfe,8);
  auVar4 = vpinsrb_avx(auVar4,0xfe,9);
  auVar4 = vpinsrb_avx(auVar4,0xfe,10);
  auVar4 = vpinsrb_avx(auVar4,0xfe,0xb);
  auVar4 = vpinsrb_avx(auVar4,0xfe,0xc);
  auVar4 = vpinsrb_avx(auVar4,0xfe,0xd);
  auVar4 = vpinsrb_avx(auVar4,0xfe,0xe);
  auVar5 = vpinsrb_avx(auVar4,0xfe,0xf);
  auVar4._8_8_ = uStack_3b50;
  auVar4._0_8_ = uStack_3b50;
  auVar4 = vpsubusb_avx(auVar4,local_4140._0_16_);
  auVar41._8_8_ = uStack_3b50;
  auVar41._0_8_ = uStack_3b50;
  auVar10 = vpsubusb_avx(local_4140._0_16_,auVar41);
  auVar4 = vpor_avx(auVar4,auVar10);
  auVar10._8_8_ = uStack_3bb0;
  auVar10._0_8_ = uStack_3bb0;
  auVar10 = vpsubusb_avx(auVar10,local_4160);
  auVar40._8_8_ = uStack_3bb0;
  auVar40._0_8_ = uStack_3bb0;
  auVar11 = vpsubusb_avx(local_4160,auVar40);
  auVar10 = vpor_avx(auVar10,auVar11);
  auVar11 = vpsubusb_avx(local_4140._0_16_,local_4160);
  auVar12 = vpsubusb_avx(local_4160,local_4140._0_16_);
  auVar11 = vpor_avx(auVar11,auVar12);
  auVar39._8_8_ = uStack_3b50;
  auVar39._0_8_ = uStack_3b50;
  auVar8._8_8_ = uStack_3bb0;
  auVar8._0_8_ = uStack_3bb0;
  auVar12 = vpsubusb_avx(auVar39,auVar8);
  auVar9._8_8_ = uStack_3bb0;
  auVar9._0_8_ = uStack_3bb0;
  auVar7._8_8_ = uStack_3b50;
  auVar7._0_8_ = uStack_3b50;
  auVar13 = vpsubusb_avx(auVar9,auVar7);
  auVar12 = vpor_avx(auVar12,auVar13);
  auVar10 = vpmaxub_avx(auVar4,auVar10);
  auVar4 = vpaddusb_avx(auVar11,auVar11);
  auVar5 = vpand_avx(auVar12,auVar5);
  auVar5 = vpsrlw_avx(auVar5,ZEXT416(1));
  auVar4 = vpaddusb_avx(auVar4,auVar5);
  auVar6[1] = uVar2;
  auVar6[0] = uVar2;
  auVar6[2] = uVar2;
  auVar6[3] = uVar2;
  auVar6[4] = uVar2;
  auVar6[5] = uVar2;
  auVar6[6] = uVar2;
  auVar6[7] = uVar2;
  auVar6[9] = uVar2;
  auVar6[8] = uVar2;
  auVar6[10] = uVar2;
  auVar6[0xb] = uVar2;
  auVar6[0xc] = uVar2;
  auVar6[0xd] = uVar2;
  auVar6[0xe] = uVar2;
  auVar6[0xf] = uVar2;
  auVar4 = vpsubusb_avx(auVar4,auVar6);
  auVar4 = vpcmpeqb_avx(auVar4,ZEXT816(0));
  local_40b0 = auVar3._0_8_;
  uStack_40a8 = auVar3._8_8_;
  local_3010 = auVar4._0_8_;
  uStack_3008 = auVar4._8_8_;
  auVar42._8_8_ = uStack_3008 ^ uStack_40a8;
  auVar42._0_8_ = local_3010 ^ local_40b0;
  auVar4 = vpmaxub_avx(auVar10,auVar42);
  auVar13._8_8_ = uStack_3b50;
  auVar13._0_8_ = uStack_3b50;
  auVar5 = vpsubusb_avx(local_4100._0_16_,auVar13);
  auVar12._8_8_ = uStack_3b50;
  auVar12._0_8_ = uStack_3b50;
  auVar3 = vpsubusb_avx(auVar12,local_4100._0_16_);
  auVar5 = vpor_avx(auVar5,auVar3);
  auVar3 = vpsubusb_avx(local_40e0._0_16_,local_4100._0_16_);
  auVar11 = vpsubusb_avx(local_4100._0_16_,local_40e0._0_16_);
  auVar3 = vpor_avx(auVar3,auVar11);
  auVar5 = vpmaxub_avx(auVar5,auVar3);
  auVar4 = vpmaxub_avx(auVar5,auVar4);
  auVar11._8_8_ = uStack_3bb0;
  auVar11._0_8_ = uStack_3bb0;
  auVar5 = vpsubusb_avx(local_41a0._0_16_,auVar11);
  auVar3._8_8_ = uStack_3bb0;
  auVar3._0_8_ = uStack_3bb0;
  auVar3 = vpsubusb_avx(auVar3,local_41a0._0_16_);
  auVar5 = vpor_avx(auVar5,auVar3);
  auVar3 = vpsubusb_avx(local_41c0._0_16_,local_41a0._0_16_);
  auVar11 = vpsubusb_avx(local_41a0._0_16_,local_41c0._0_16_);
  auVar3 = vpor_avx(auVar3,auVar11);
  auVar5 = vpmaxub_avx(auVar5,auVar3);
  auVar4 = vpmaxub_avx(auVar5,auVar4);
  auVar5[1] = uVar1;
  auVar5[0] = uVar1;
  auVar5[2] = uVar1;
  auVar5[3] = uVar1;
  auVar5[4] = uVar1;
  auVar5[5] = uVar1;
  auVar5[6] = uVar1;
  auVar5[7] = uVar1;
  auVar5[9] = uVar1;
  auVar5[8] = uVar1;
  auVar5[10] = uVar1;
  auVar5[0xb] = uVar1;
  auVar5[0xc] = uVar1;
  auVar5[0xd] = uVar1;
  auVar5[0xe] = uVar1;
  auVar5[0xf] = uVar1;
  auVar4 = vpsubusb_avx(auVar4,auVar5);
  auVar4 = vpcmpeqb_avx(auVar4,ZEXT816(0));
  auVar5 = vpcmpeqb_avx(auVar4,ZEXT816(0));
  if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar5[0xf] >> 7) << 0xf) != 0xffff) {
    uVar1 = *in_R8;
    auVar5 = vpinsrb_avx(ZEXT116(1),1,1);
    auVar5 = vpinsrb_avx(auVar5,1,2);
    auVar5 = vpinsrb_avx(auVar5,1,3);
    auVar5 = vpinsrb_avx(auVar5,1,4);
    auVar5 = vpinsrb_avx(auVar5,1,5);
    auVar5 = vpinsrb_avx(auVar5,1,6);
    auVar5 = vpinsrb_avx(auVar5,1,7);
    auVar5 = vpinsrb_avx(auVar5,1,8);
    auVar5 = vpinsrb_avx(auVar5,1,9);
    auVar5 = vpinsrb_avx(auVar5,1,10);
    auVar5 = vpinsrb_avx(auVar5,1,0xb);
    auVar5 = vpinsrb_avx(auVar5,1,0xc);
    auVar5 = vpinsrb_avx(auVar5,1,0xd);
    auVar5 = vpinsrb_avx(auVar5,1,0xe);
    auVar12 = vpinsrb_avx(auVar5,1,0xf);
    auVar5 = vpinsrb_avx(ZEXT116(3),3,1);
    auVar5 = vpinsrb_avx(auVar5,3,2);
    auVar5 = vpinsrb_avx(auVar5,3,3);
    auVar5 = vpinsrb_avx(auVar5,3,4);
    auVar5 = vpinsrb_avx(auVar5,3,5);
    auVar5 = vpinsrb_avx(auVar5,3,6);
    auVar5 = vpinsrb_avx(auVar5,3,7);
    auVar5 = vpinsrb_avx(auVar5,3,8);
    auVar5 = vpinsrb_avx(auVar5,3,9);
    auVar5 = vpinsrb_avx(auVar5,3,10);
    auVar5 = vpinsrb_avx(auVar5,3,0xb);
    auVar5 = vpinsrb_avx(auVar5,3,0xc);
    auVar5 = vpinsrb_avx(auVar5,3,0xd);
    auVar5 = vpinsrb_avx(auVar5,3,0xe);
    auVar11 = vpinsrb_avx(auVar5,3,0xf);
    auVar5 = vpaddb_avx(auVar12,auVar11);
    auVar3 = vpinsrb_avx(ZEXT116(0x80),0x80,1);
    auVar3 = vpinsrb_avx(auVar3,0x80,2);
    auVar3 = vpinsrb_avx(auVar3,0x80,3);
    auVar3 = vpinsrb_avx(auVar3,0x80,4);
    auVar3 = vpinsrb_avx(auVar3,0x80,5);
    auVar3 = vpinsrb_avx(auVar3,0x80,6);
    auVar3 = vpinsrb_avx(auVar3,0x80,7);
    auVar3 = vpinsrb_avx(auVar3,0x80,8);
    auVar3 = vpinsrb_avx(auVar3,0x80,9);
    auVar3 = vpinsrb_avx(auVar3,0x80,10);
    auVar3 = vpinsrb_avx(auVar3,0x80,0xb);
    auVar3 = vpinsrb_avx(auVar3,0x80,0xc);
    auVar3 = vpinsrb_avx(auVar3,0x80,0xd);
    auVar3 = vpinsrb_avx(auVar3,0x80,0xe);
    auVar13 = vpinsrb_avx(auVar3,0x80,0xf);
    local_120 = auVar13._0_8_;
    uStack_118 = auVar13._8_8_;
    auVar3 = vpinsrb_avx(ZEXT116(0xe0),0xe0,1);
    auVar3 = vpinsrb_avx(auVar3,0xe0,2);
    auVar3 = vpinsrb_avx(auVar3,0xe0,3);
    auVar3 = vpinsrb_avx(auVar3,0xe0,4);
    auVar3 = vpinsrb_avx(auVar3,0xe0,5);
    auVar3 = vpinsrb_avx(auVar3,0xe0,6);
    auVar3 = vpinsrb_avx(auVar3,0xe0,7);
    auVar3 = vpinsrb_avx(auVar3,0xe0,8);
    auVar3 = vpinsrb_avx(auVar3,0xe0,9);
    auVar3 = vpinsrb_avx(auVar3,0xe0,10);
    auVar3 = vpinsrb_avx(auVar3,0xe0,0xb);
    auVar3 = vpinsrb_avx(auVar3,0xe0,0xc);
    auVar3 = vpinsrb_avx(auVar3,0xe0,0xd);
    auVar3 = vpinsrb_avx(auVar3,0xe0,0xe);
    auVar6 = vpinsrb_avx(auVar3,0xe0,0xf);
    auVar3 = vpinsrb_avx(ZEXT116(0x1f),0x1f,1);
    auVar3 = vpinsrb_avx(auVar3,0x1f,2);
    auVar3 = vpinsrb_avx(auVar3,0x1f,3);
    auVar3 = vpinsrb_avx(auVar3,0x1f,4);
    auVar3 = vpinsrb_avx(auVar3,0x1f,5);
    auVar3 = vpinsrb_avx(auVar3,0x1f,6);
    auVar3 = vpinsrb_avx(auVar3,0x1f,7);
    auVar3 = vpinsrb_avx(auVar3,0x1f,8);
    auVar3 = vpinsrb_avx(auVar3,0x1f,9);
    auVar3 = vpinsrb_avx(auVar3,0x1f,10);
    auVar3 = vpinsrb_avx(auVar3,0x1f,0xb);
    auVar3 = vpinsrb_avx(auVar3,0x1f,0xc);
    auVar3 = vpinsrb_avx(auVar3,0x1f,0xd);
    auVar3 = vpinsrb_avx(auVar3,0x1f,0xe);
    auVar7 = vpinsrb_avx(auVar3,0x1f,0xf);
    auVar8 = vpsubb_avx(auVar13,auVar12);
    auVar38[1] = uVar1;
    auVar38[0] = uVar1;
    auVar38[2] = uVar1;
    auVar38[3] = uVar1;
    auVar38[4] = uVar1;
    auVar38[5] = uVar1;
    auVar38[6] = uVar1;
    auVar38[7] = uVar1;
    auVar38[9] = uVar1;
    auVar38[8] = uVar1;
    auVar38[10] = uVar1;
    auVar38[0xb] = uVar1;
    auVar38[0xc] = uVar1;
    auVar38[0xd] = uVar1;
    auVar38[0xe] = uVar1;
    auVar38[0xf] = uVar1;
    auVar3 = vpsubusb_avx(auVar10,auVar38);
    auVar3 = vpcmpeqb_avx(auVar3,ZEXT816(0));
    local_3030 = auVar3._0_8_;
    uStack_3028 = auVar3._8_8_;
    auVar49._8_8_ = uStack_3b50 ^ uStack_118;
    auVar49._0_8_ = uStack_3b50 ^ local_120;
    auVar48._8_8_ = uStack_3bb0 ^ uStack_118;
    auVar48._0_8_ = uStack_3bb0 ^ local_120;
    auVar3 = vpsubsb_avx(auVar49,auVar48);
    auVar43._8_8_ = uStack_3028 ^ uStack_40a8;
    auVar43._0_8_ = local_3030 ^ local_40b0;
    auVar3 = vpand_avx(auVar3,auVar43);
    auVar47._8_8_ = (ulong)in_RDI ^ uStack_118;
    auVar47._0_8_ = uStack_3b90 ^ local_120;
    auVar46._8_8_ = local_4140._8_8_ ^ uStack_118;
    auVar46._0_8_ = uStack_3b70 ^ local_120;
    auVar9 = vpsubsb_avx(auVar47,auVar46);
    auVar3 = vpaddsb_avx(auVar3,auVar9);
    auVar3 = vpaddsb_avx(auVar3,auVar9);
    auVar3 = vpaddsb_avx(auVar3,auVar9);
    auVar3 = vpand_avx(auVar3,auVar4);
    auVar5 = vpaddsb_avx(auVar3,auVar5);
    auVar3 = vpaddsb_avx(auVar3,auVar11);
    auVar11 = vpcmpgtb_avx(ZEXT816(0),auVar5);
    auVar9 = vpsrlw_avx(auVar5,ZEXT416(3));
    auVar5 = vpand_avx(auVar11,auVar6);
    auVar11 = vpand_avx(auVar9,auVar7);
    auVar11 = vpor_avx(auVar11,auVar5);
    auVar45._8_8_ = (ulong)in_RDI ^ uStack_118;
    auVar45._0_8_ = uStack_3b90 ^ local_120;
    auVar5 = vpsubsb_avx(auVar45,auVar11);
    local_30d0 = auVar5._0_8_;
    uStack_30c8 = auVar5._8_8_;
    auVar5 = vpcmpgtb_avx(ZEXT816(0),auVar3);
    auVar3 = vpsrlw_avx(auVar3,ZEXT416(3));
    auVar5 = vpand_avx(auVar5,auVar6);
    auVar3 = vpand_avx(auVar3,auVar7);
    auVar5 = vpor_avx(auVar3,auVar5);
    auVar51._8_8_ = local_4140._8_8_ ^ uStack_118;
    auVar51._0_8_ = uStack_3b70 ^ local_120;
    auVar5 = vpaddsb_avx(auVar51,auVar5);
    local_30f0 = auVar5._0_8_;
    uStack_30e8 = auVar5._8_8_;
    auVar5 = vpaddsb_avx(auVar11,auVar12);
    auVar3 = vpcmpgtb_avx(ZEXT816(0),auVar5);
    auVar11 = vpsrlw_avx(auVar5,ZEXT416(1));
    auVar5 = vpand_avx(auVar3,auVar13);
    auVar3 = vpand_avx(auVar11,auVar8);
    auVar5 = vpor_avx(auVar3,auVar5);
    auVar52._8_8_ = uStack_3028 ^ uStack_40a8;
    auVar52._0_8_ = local_3030 ^ local_40b0;
    auVar3 = vpandn_avx(auVar52,auVar5);
    auVar50._8_8_ = uStack_3b50 ^ uStack_118;
    auVar50._0_8_ = uStack_3b50 ^ local_120;
    auVar5 = vpaddsb_avx(auVar50,auVar3);
    local_3110 = auVar5._0_8_;
    uStack_3108 = auVar5._8_8_;
    auVar44._8_8_ = uStack_3bb0 ^ uStack_118;
    auVar44._0_8_ = uStack_3bb0 ^ local_120;
    auVar5 = vpsubsb_avx(auVar44,auVar3);
    local_3130 = auVar5._0_8_;
    uStack_3128 = auVar5._8_8_;
    auVar32 = vpblendd_avx2(local_4140,_local_4160,0xf0);
    auVar33 = vpblendd_avx2(local_4100,local_41a0,0xf0);
    auVar34 = vpblendd_avx2(local_40e0,local_41c0,0xf0);
    auVar29 = vpsubusb_avx2(auVar33,auVar32);
    auVar30 = vpsubusb_avx2(auVar32,auVar33);
    auVar29 = vpor_avx2(auVar29,auVar30);
    auVar30 = vpsubusb_avx2(auVar34,auVar32);
    auVar31 = vpsubusb_avx2(auVar32,auVar34);
    auVar30 = vpor_avx2(auVar30,auVar31);
    auVar29 = vpmaxub_avx2(auVar29,auVar30);
    auVar5 = vpmaxub_avx(auVar29._0_16_,auVar29._16_16_);
    auVar5 = vpmaxub_avx(auVar5,auVar10);
    auVar5 = vpsubusb_avx(auVar5,auVar12);
    auVar5 = vpcmpeqb_avx(auVar5,ZEXT816(0));
    auVar4 = vpand_avx(auVar5,auVar4);
    local_4090 = auVar4._0_8_;
    uStack_4088 = auVar4._8_8_;
    auVar5 = vpcmpeqb_avx(auVar4,ZEXT816(0));
    if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar5[0xf] >> 7) << 0xf) == 0xffff) {
      puVar82 = (ulong *)((long)in_RDI - (long)(in_ESI << 1));
      *puVar82 = local_3110 ^ local_120;
      puVar82[1] = uStack_3108 ^ uStack_118;
      *(ulong *)((long)in_RDI - (long)in_ESI) = local_30f0 ^ local_120;
      ((ulong *)((long)in_RDI - (long)in_ESI))[1] = uStack_30e8 ^ uStack_118;
      *in_RDI = local_30d0 ^ local_120;
      in_RDI[1] = uStack_30c8 ^ uStack_118;
      *(ulong *)((long)in_RDI + (long)in_ESI) = local_3130 ^ local_120;
      ((ulong *)((long)in_RDI + (long)in_ESI))[1] = uStack_3128 ^ uStack_118;
    }
    else {
      auVar5 = vpinsrw_avx(ZEXT216(8),8,1);
      auVar5 = vpinsrw_avx(auVar5,8,2);
      auVar5 = vpinsrw_avx(auVar5,8,3);
      auVar5 = vpinsrw_avx(auVar5,8,4);
      auVar5 = vpinsrw_avx(auVar5,8,5);
      auVar5 = vpinsrw_avx(auVar5,8,6);
      auVar3 = vpinsrw_avx(auVar5,8,7);
      auVar5 = vpinsrw_avx(ZEXT216(8),8,1);
      auVar5 = vpinsrw_avx(auVar5,8,2);
      auVar5 = vpinsrw_avx(auVar5,8,3);
      auVar5 = vpinsrw_avx(auVar5,8,4);
      auVar5 = vpinsrw_avx(auVar5,8,5);
      auVar5 = vpinsrw_avx(auVar5,8,6);
      auVar5 = vpinsrw_avx(auVar5,8,7);
      uStack_b0 = auVar5._0_8_;
      uStack_a8 = auVar5._8_8_;
      auVar5 = vpinsrw_avx(ZEXT216(4),4,1);
      auVar5 = vpinsrw_avx(auVar5,4,2);
      auVar5 = vpinsrw_avx(auVar5,4,3);
      auVar5 = vpinsrw_avx(auVar5,4,4);
      auVar5 = vpinsrw_avx(auVar5,4,5);
      auVar5 = vpinsrw_avx(auVar5,4,6);
      auVar10 = vpinsrw_avx(auVar5,4,7);
      auVar5 = vpinsrw_avx(ZEXT216(4),4,1);
      auVar5 = vpinsrw_avx(auVar5,4,2);
      auVar5 = vpinsrw_avx(auVar5,4,3);
      auVar5 = vpinsrw_avx(auVar5,4,4);
      auVar5 = vpinsrw_avx(auVar5,4,5);
      auVar5 = vpinsrw_avx(auVar5,4,6);
      auVar5 = vpinsrw_avx(auVar5,4,7);
      uStack_70 = auVar5._0_8_;
      uStack_68 = auVar5._8_8_;
      local_4580._8_8_ = (long)in_RDI - (long)(in_ESI * 5);
      local_4580._0_8_ = uStack_3c10;
      local_4580._16_8_ = uStack_3c10;
      local_4580._24_8_ = local_4580._8_8_;
      local_45a0._8_8_ = (long)in_RDI + (long)(in_ESI << 2);
      local_45a0._0_8_ = uStack_3c30;
      local_45a0._16_8_ = uStack_3c30;
      local_45a0._24_8_ = local_45a0._8_8_;
      local_45c0._8_8_ = (long)in_RDI - (long)(in_ESI * 6);
      local_45c0._0_8_ = uStack_3c50;
      local_45c0._16_8_ = uStack_3c50;
      local_45c0._24_8_ = local_45c0._8_8_;
      local_45e0._8_8_ = (long)in_RDI + (long)(in_ESI * 5);
      local_45e0._0_8_ = uStack_3c70;
      local_45e0._16_8_ = uStack_3c70;
      local_45e0._24_8_ = local_45e0._8_8_;
      local_4600._8_8_ = (long)in_RDI - (long)(in_ESI * 7);
      local_4600._0_8_ = uStack_3c90;
      local_4600._16_8_ = uStack_3c90;
      local_4600._24_8_ = local_4600._8_8_;
      local_4620._8_8_ = (long)in_RDI + (long)(in_ESI * 6);
      local_4620._0_8_ = uStack_3cb0;
      local_4620._16_8_ = uStack_3cb0;
      local_4620._24_8_ = local_4620._8_8_;
      auVar35 = vpblendd_avx2(local_4580,local_45a0,0xf0);
      auVar36 = vpblendd_avx2(local_45c0,local_45e0,0xf0);
      auVar37 = vpblendd_avx2(local_4600,local_4620,0xf0);
      auVar29 = vpsubusb_avx2(auVar35,auVar32);
      auVar30 = vpsubusb_avx2(auVar32,auVar35);
      auVar29 = vpor_avx2(auVar29,auVar30);
      auVar30 = vpsubusb_avx2(auVar36,auVar32);
      auVar31 = vpsubusb_avx2(auVar32,auVar36);
      auVar30 = vpor_avx2(auVar30,auVar31);
      auVar31 = vpsubusb_avx2(auVar37,auVar32);
      auVar32 = vpsubusb_avx2(auVar32,auVar37);
      auVar31 = vpor_avx2(auVar31,auVar32);
      auVar29 = vpmaxub_avx2(auVar29,auVar30);
      auVar29 = vpmaxub_avx2(auVar29,auVar31);
      auVar5 = vpmaxub_avx(auVar29._0_16_,auVar29._16_16_);
      auVar5 = vpsubusb_avx(auVar5,auVar12);
      auVar5 = vpcmpeqb_avx(auVar5,ZEXT816(0));
      auVar5 = vpand_avx(auVar5,auVar4);
      auVar23._16_8_ = uStack_3b10;
      auVar23._0_16_ = local_40e0._0_16_;
      auVar23._24_8_ = local_40e0._8_8_;
      auVar15[8] = '\x04';
      auVar15[9] = 0x80;
      auVar15[10] = '\x05';
      auVar15[0xb] = 0x80;
      auVar15[0xc] = '\x06';
      auVar15[0xd] = 0x80;
      auVar15[0xe] = '\a';
      auVar15[0xf] = 0x80;
      auVar15[0] = '\0';
      auVar15[1] = 0x80;
      auVar15[2] = '\x01';
      auVar15[3] = 0x80;
      auVar15[4] = '\x02';
      auVar15[5] = 0x80;
      auVar15[6] = '\x03';
      auVar15[7] = 0x80;
      auVar15[0x10] = '\b';
      auVar15[0x11] = 0x80;
      auVar15[0x12] = '\t';
      auVar15[0x13] = 0x80;
      auVar15[0x14] = '\n';
      auVar15[0x15] = 0x80;
      auVar15[0x16] = '\v';
      auVar15[0x17] = 0x80;
      auVar15[0x18] = '\f';
      auVar15[0x19] = 0x80;
      auVar15[0x1a] = '\r';
      auVar15[0x1b] = 0x80;
      auVar15[0x1c] = '\x0e';
      auVar15[0x1d] = 0x80;
      auVar15[0x1e] = '\x0f';
      auVar15[0x1f] = 0x80;
      auVar15 = vpshufb_avx2(auVar23,auVar15);
      auVar22._16_8_ = uStack_3b30;
      auVar22._0_16_ = local_4100._0_16_;
      auVar22._24_8_ = local_4100._8_8_;
      auVar16[8] = '\x04';
      auVar16[9] = 0x80;
      auVar16[10] = '\x05';
      auVar16[0xb] = 0x80;
      auVar16[0xc] = '\x06';
      auVar16[0xd] = 0x80;
      auVar16[0xe] = '\a';
      auVar16[0xf] = 0x80;
      auVar16[0] = '\0';
      auVar16[1] = 0x80;
      auVar16[2] = '\x01';
      auVar16[3] = 0x80;
      auVar16[4] = '\x02';
      auVar16[5] = 0x80;
      auVar16[6] = '\x03';
      auVar16[7] = 0x80;
      auVar16[0x10] = '\b';
      auVar16[0x11] = 0x80;
      auVar16[0x12] = '\t';
      auVar16[0x13] = 0x80;
      auVar16[0x14] = '\n';
      auVar16[0x15] = 0x80;
      auVar16[0x16] = '\v';
      auVar16[0x17] = 0x80;
      auVar16[0x18] = '\f';
      auVar16[0x19] = 0x80;
      auVar16[0x1a] = '\r';
      auVar16[0x1b] = 0x80;
      auVar16[0x1c] = '\x0e';
      auVar16[0x1d] = 0x80;
      auVar16[0x1e] = '\x0f';
      auVar16[0x1f] = 0x80;
      auVar16 = vpshufb_avx2(auVar22,auVar16);
      auVar21._8_8_ = uStack_3b50;
      auVar21._0_8_ = uStack_3b50;
      auVar21._16_8_ = uStack_3b50;
      auVar21._24_8_ = uStack_3b50;
      auVar17[8] = '\x04';
      auVar17[9] = 0x80;
      auVar17[10] = '\x05';
      auVar17[0xb] = 0x80;
      auVar17[0xc] = '\x06';
      auVar17[0xd] = 0x80;
      auVar17[0xe] = '\a';
      auVar17[0xf] = 0x80;
      auVar17[0] = '\0';
      auVar17[1] = 0x80;
      auVar17[2] = '\x01';
      auVar17[3] = 0x80;
      auVar17[4] = '\x02';
      auVar17[5] = 0x80;
      auVar17[6] = '\x03';
      auVar17[7] = 0x80;
      auVar17[0x10] = '\b';
      auVar17[0x11] = 0x80;
      auVar17[0x12] = '\t';
      auVar17[0x13] = 0x80;
      auVar17[0x14] = '\n';
      auVar17[0x15] = 0x80;
      auVar17[0x16] = '\v';
      auVar17[0x17] = 0x80;
      auVar17[0x18] = '\f';
      auVar17[0x19] = 0x80;
      auVar17[0x1a] = '\r';
      auVar17[0x1b] = 0x80;
      auVar17[0x1c] = '\x0e';
      auVar17[0x1d] = 0x80;
      auVar17[0x1e] = '\x0f';
      auVar17[0x1f] = 0x80;
      auVar17 = vpshufb_avx2(auVar21,auVar17);
      auVar20._16_8_ = uStack_3b70;
      auVar20._0_16_ = local_4140._0_16_;
      auVar20._24_8_ = local_4140._8_8_;
      auVar18[8] = '\x04';
      auVar18[9] = 0x80;
      auVar18[10] = '\x05';
      auVar18[0xb] = 0x80;
      auVar18[0xc] = '\x06';
      auVar18[0xd] = 0x80;
      auVar18[0xe] = '\a';
      auVar18[0xf] = 0x80;
      auVar18[0] = '\0';
      auVar18[1] = 0x80;
      auVar18[2] = '\x01';
      auVar18[3] = 0x80;
      auVar18[4] = '\x02';
      auVar18[5] = 0x80;
      auVar18[6] = '\x03';
      auVar18[7] = 0x80;
      auVar18[0x10] = '\b';
      auVar18[0x11] = 0x80;
      auVar18[0x12] = '\t';
      auVar18[0x13] = 0x80;
      auVar18[0x14] = '\n';
      auVar18[0x15] = 0x80;
      auVar18[0x16] = '\v';
      auVar18[0x17] = 0x80;
      auVar18[0x18] = '\f';
      auVar18[0x19] = 0x80;
      auVar18[0x1a] = '\r';
      auVar18[0x1b] = 0x80;
      auVar18[0x1c] = '\x0e';
      auVar18[0x1d] = 0x80;
      auVar18[0x1e] = '\x0f';
      auVar18[0x1f] = 0x80;
      auVar18 = vpshufb_avx2(auVar20,auVar18);
      auVar19._16_8_ = uStack_3b90;
      auVar19._0_16_ = local_4160;
      auVar19._24_8_ = in_RDI;
      auVar14[8] = '\x04';
      auVar14[9] = 0x80;
      auVar14[10] = '\x05';
      auVar14[0xb] = 0x80;
      auVar14[0xc] = '\x06';
      auVar14[0xd] = 0x80;
      auVar14[0xe] = '\a';
      auVar14[0xf] = 0x80;
      auVar14[0] = '\0';
      auVar14[1] = 0x80;
      auVar14[2] = '\x01';
      auVar14[3] = 0x80;
      auVar14[4] = '\x02';
      auVar14[5] = 0x80;
      auVar14[6] = '\x03';
      auVar14[7] = 0x80;
      auVar14[0x10] = '\b';
      auVar14[0x11] = 0x80;
      auVar14[0x12] = '\t';
      auVar14[0x13] = 0x80;
      auVar14[0x14] = '\n';
      auVar14[0x15] = 0x80;
      auVar14[0x16] = '\v';
      auVar14[0x17] = 0x80;
      auVar14[0x18] = '\f';
      auVar14[0x19] = 0x80;
      auVar14[0x1a] = '\r';
      auVar14[0x1b] = 0x80;
      auVar14[0x1c] = '\x0e';
      auVar14[0x1d] = 0x80;
      auVar14[0x1e] = '\x0f';
      auVar14[0x1f] = 0x80;
      auVar19 = vpshufb_avx2(auVar19,auVar14);
      auVar28._8_8_ = uStack_3bb0;
      auVar28._0_8_ = uStack_3bb0;
      auVar28._16_8_ = uStack_3bb0;
      auVar28._24_8_ = uStack_3bb0;
      auVar37[8] = '\x04';
      auVar37[9] = 0x80;
      auVar37[10] = '\x05';
      auVar37[0xb] = 0x80;
      auVar37[0xc] = '\x06';
      auVar37[0xd] = 0x80;
      auVar37[0xe] = '\a';
      auVar37[0xf] = 0x80;
      auVar37[0] = '\0';
      auVar37[1] = 0x80;
      auVar37[2] = '\x01';
      auVar37[3] = 0x80;
      auVar37[4] = '\x02';
      auVar37[5] = 0x80;
      auVar37[6] = '\x03';
      auVar37[7] = 0x80;
      auVar37[0x10] = '\b';
      auVar37[0x11] = 0x80;
      auVar37[0x12] = '\t';
      auVar37[0x13] = 0x80;
      auVar37[0x14] = '\n';
      auVar37[0x15] = 0x80;
      auVar37[0x16] = '\v';
      auVar37[0x17] = 0x80;
      auVar37[0x18] = '\f';
      auVar37[0x19] = 0x80;
      auVar37[0x1a] = '\r';
      auVar37[0x1b] = 0x80;
      auVar37[0x1c] = '\x0e';
      auVar37[0x1d] = 0x80;
      auVar37[0x1e] = '\x0f';
      auVar37[0x1f] = 0x80;
      auVar20 = vpshufb_avx2(auVar28,auVar37);
      auVar32._16_8_ = uStack_3bd0;
      auVar32._0_16_ = local_41a0._0_16_;
      auVar32._24_8_ = local_41a0._8_8_;
      auVar31[8] = '\x04';
      auVar31[9] = 0x80;
      auVar31[10] = '\x05';
      auVar31[0xb] = 0x80;
      auVar31[0xc] = '\x06';
      auVar31[0xd] = 0x80;
      auVar31[0xe] = '\a';
      auVar31[0xf] = 0x80;
      auVar31[0] = '\0';
      auVar31[1] = 0x80;
      auVar31[2] = '\x01';
      auVar31[3] = 0x80;
      auVar31[4] = '\x02';
      auVar31[5] = 0x80;
      auVar31[6] = '\x03';
      auVar31[7] = 0x80;
      auVar31[0x10] = '\b';
      auVar31[0x11] = 0x80;
      auVar31[0x12] = '\t';
      auVar31[0x13] = 0x80;
      auVar31[0x14] = '\n';
      auVar31[0x15] = 0x80;
      auVar31[0x16] = '\v';
      auVar31[0x17] = 0x80;
      auVar31[0x18] = '\f';
      auVar31[0x19] = 0x80;
      auVar31[0x1a] = '\r';
      auVar31[0x1b] = 0x80;
      auVar31[0x1c] = '\x0e';
      auVar31[0x1d] = 0x80;
      auVar31[0x1e] = '\x0f';
      auVar31[0x1f] = 0x80;
      auVar21 = vpshufb_avx2(auVar32,auVar31);
      auVar30._16_8_ = uStack_3bf0;
      auVar30._0_16_ = local_41c0._0_16_;
      auVar30._24_8_ = local_41c0._8_8_;
      auVar29[8] = '\x04';
      auVar29[9] = 0x80;
      auVar29[10] = '\x05';
      auVar29[0xb] = 0x80;
      auVar29[0xc] = '\x06';
      auVar29[0xd] = 0x80;
      auVar29[0xe] = '\a';
      auVar29[0xf] = 0x80;
      auVar29[0] = '\0';
      auVar29[1] = 0x80;
      auVar29[2] = '\x01';
      auVar29[3] = 0x80;
      auVar29[4] = '\x02';
      auVar29[5] = 0x80;
      auVar29[6] = '\x03';
      auVar29[7] = 0x80;
      auVar29[0x10] = '\b';
      auVar29[0x11] = 0x80;
      auVar29[0x12] = '\t';
      auVar29[0x13] = 0x80;
      auVar29[0x14] = '\n';
      auVar29[0x15] = 0x80;
      auVar29[0x16] = '\v';
      auVar29[0x17] = 0x80;
      auVar29[0x18] = '\f';
      auVar29[0x19] = 0x80;
      auVar29[0x1a] = '\r';
      auVar29[0x1b] = 0x80;
      auVar29[0x1c] = '\x0e';
      auVar29[0x1d] = 0x80;
      auVar29[0x1e] = '\x0f';
      auVar29[0x1f] = 0x80;
      auVar22 = vpshufb_avx2(auVar30,auVar29);
      auVar29 = vpaddw_avx2(auVar16,auVar17);
      auVar30 = vpaddw_avx2(auVar18,auVar29);
      auVar29 = vpaddw_avx2(auVar21,auVar20);
      auVar31 = vpaddw_avx2(auVar19,auVar29);
      auVar29 = vpaddw_avx2(auVar30,auVar31);
      auVar25._16_8_ = uStack_70;
      auVar25._0_16_ = auVar10;
      auVar25._24_8_ = uStack_68;
      auVar29 = vpaddw_avx2(auVar25,auVar29);
      local_47a0 = auVar29._0_8_;
      auVar32 = vpaddw_avx2(auVar29,auVar15);
      auVar29 = vpaddw_avx2(auVar32,auVar18);
      auVar28 = vpsrlw_avx2(auVar29,ZEXT416(3));
      auVar24._8_8_ = local_47a0;
      auVar24._0_8_ = local_47a0;
      auVar24._16_8_ = local_47a0;
      auVar24._24_8_ = local_47a0;
      auVar37 = vpaddw_avx2(auVar24,auVar22);
      auVar29 = vpaddw_avx2(auVar37,auVar19);
      auVar29 = vpsrlw_avx2(auVar29,ZEXT416(3));
      auVar29 = vpackuswb_avx2(auVar28,auVar29);
      auVar29 = vpermq_avx2(auVar29,0xd8);
      auVar73._16_8_ = local_4090;
      auVar73._0_16_ = auVar4;
      auVar73._24_8_ = uStack_4088;
      auVar72._8_8_ = uStack_30e8 ^ uStack_118;
      auVar72._0_8_ = local_30f0 ^ local_120;
      auVar72._16_8_ = local_30d0 ^ local_120;
      auVar72._24_8_ = uStack_30c8 ^ uStack_118;
      auVar28 = vpandn_avx2(auVar73,auVar72);
      auVar80._16_8_ = local_4090;
      auVar80._0_16_ = auVar4;
      auVar80._24_8_ = uStack_4088;
      auVar29 = vpand_avx2(auVar80,auVar29);
      auVar14 = vpor_avx2(auVar29,auVar28);
      local_4400 = auVar14._0_8_;
      uStack_43f8 = auVar14._8_8_;
      uStack_43f0 = auVar14._16_8_;
      uStack_43e8 = auVar14._24_8_;
      auVar29 = vpsubw_avx2(auVar15,auVar21);
      auVar32 = vpaddw_avx2(auVar32,auVar29);
      auVar29 = vpaddw_avx2(auVar32,auVar17);
      auVar28 = vpsrlw_avx2(auVar29,ZEXT416(3));
      auVar29 = vpsubw_avx2(auVar22,auVar16);
      auVar37 = vpaddw_avx2(auVar37,auVar29);
      auVar29 = vpaddw_avx2(auVar37,auVar20);
      auVar29 = vpsrlw_avx2(auVar29,ZEXT416(3));
      auVar29 = vpackuswb_avx2(auVar28,auVar29);
      auVar29 = vpermq_avx2(auVar29,0xd8);
      auVar71._16_8_ = local_4090;
      auVar71._0_16_ = auVar4;
      auVar71._24_8_ = uStack_4088;
      auVar27._8_8_ = uStack_3108 ^ uStack_118;
      auVar27._0_8_ = local_3110 ^ local_120;
      auVar27._16_8_ = local_3130 ^ local_120;
      auVar27._24_8_ = uStack_3128 ^ uStack_118;
      auVar28 = vpandn_avx2(auVar71,auVar27);
      auVar79._16_8_ = local_4090;
      auVar79._0_16_ = auVar4;
      auVar79._24_8_ = uStack_4088;
      auVar29 = vpand_avx2(auVar79,auVar29);
      auVar28 = vpor_avx2(auVar29,auVar28);
      local_48a0 = auVar28._0_8_;
      uStack_4898 = auVar28._8_8_;
      uStack_4890 = auVar28._16_8_;
      uStack_4888 = auVar28._24_8_;
      auVar29 = vpsubw_avx2(auVar15,auVar20);
      auVar29 = vpaddw_avx2(auVar32,auVar29);
      auVar29 = vpaddw_avx2(auVar29,auVar16);
      auVar32 = vpsrlw_avx2(auVar29,ZEXT416(3));
      auVar29 = vpsubw_avx2(auVar22,auVar17);
      auVar29 = vpaddw_avx2(auVar37,auVar29);
      auVar29 = vpaddw_avx2(auVar29,auVar21);
      auVar29 = vpsrlw_avx2(auVar29,ZEXT416(3));
      auVar29 = vpackuswb_avx2(auVar32,auVar29);
      auVar29 = vpermq_avx2(auVar29,0xd8);
      auVar26._16_8_ = local_4090;
      auVar26._0_16_ = auVar4;
      auVar26._24_8_ = uStack_4088;
      auVar32 = vpandn_avx2(auVar26,auVar33);
      auVar33._16_8_ = local_4090;
      auVar33._0_16_ = auVar4;
      auVar33._24_8_ = uStack_4088;
      auVar29 = vpand_avx2(auVar33,auVar29);
      auVar29 = vpor_avx2(auVar29,auVar32);
      local_4420 = auVar29._0_8_;
      uStack_4418 = auVar29._8_8_;
      uStack_4410 = auVar29._16_8_;
      uStack_4408 = auVar29._24_8_;
      local_4710 = auVar5._0_8_;
      uStack_4708 = auVar5._8_8_;
      auVar4 = vpcmpeqb_avx(auVar5,ZEXT816(0));
      if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) == 0xffff) {
        puVar81 = (undefined8 *)((long)in_RDI - (long)(in_ESI * 3));
        *puVar81 = local_4420;
        puVar81[1] = uStack_4418;
        puVar81 = (undefined8 *)((long)in_RDI - (long)(in_ESI << 1));
        *puVar81 = local_48a0;
        puVar81[1] = uStack_4898;
        *(undefined8 *)((long)in_RDI - (long)in_ESI) = local_4400;
        ((undefined8 *)((long)in_RDI - (long)in_ESI))[1] = uStack_43f8;
        *in_RDI = uStack_43f0;
        in_RDI[1] = uStack_43e8;
        *(undefined8 *)((long)in_RDI + (long)in_ESI) = uStack_4890;
        ((undefined8 *)((long)in_RDI + (long)in_ESI))[1] = uStack_4888;
        puVar81 = (undefined8 *)((long)in_RDI + (long)(in_ESI << 1));
        *puVar81 = uStack_4410;
        puVar81[1] = uStack_4408;
      }
      else {
        auVar64._16_8_ = uStack_3c90;
        auVar64._0_16_ = local_4600._0_16_;
        auVar64._24_8_ = local_4600._8_8_;
        auVar63[8] = '\x04';
        auVar63[9] = 0x80;
        auVar63[10] = '\x05';
        auVar63[0xb] = 0x80;
        auVar63[0xc] = '\x06';
        auVar63[0xd] = 0x80;
        auVar63[0xe] = '\a';
        auVar63[0xf] = 0x80;
        auVar63[0] = '\0';
        auVar63[1] = 0x80;
        auVar63[2] = '\x01';
        auVar63[3] = 0x80;
        auVar63[4] = '\x02';
        auVar63[5] = 0x80;
        auVar63[6] = '\x03';
        auVar63[7] = 0x80;
        auVar63[0x10] = '\b';
        auVar63[0x11] = 0x80;
        auVar63[0x12] = '\t';
        auVar63[0x13] = 0x80;
        auVar63[0x14] = '\n';
        auVar63[0x15] = 0x80;
        auVar63[0x16] = '\v';
        auVar63[0x17] = 0x80;
        auVar63[0x18] = '\f';
        auVar63[0x19] = 0x80;
        auVar63[0x1a] = '\r';
        auVar63[0x1b] = 0x80;
        auVar63[0x1c] = '\x0e';
        auVar63[0x1d] = 0x80;
        auVar63[0x1e] = '\x0f';
        auVar63[0x1f] = 0x80;
        auVar37 = vpshufb_avx2(auVar64,auVar63);
        auVar62._16_8_ = uStack_3c50;
        auVar62._0_16_ = local_45c0._0_16_;
        auVar62._24_8_ = local_45c0._8_8_;
        auVar61[8] = '\x04';
        auVar61[9] = 0x80;
        auVar61[10] = '\x05';
        auVar61[0xb] = 0x80;
        auVar61[0xc] = '\x06';
        auVar61[0xd] = 0x80;
        auVar61[0xe] = '\a';
        auVar61[0xf] = 0x80;
        auVar61[0] = '\0';
        auVar61[1] = 0x80;
        auVar61[2] = '\x01';
        auVar61[3] = 0x80;
        auVar61[4] = '\x02';
        auVar61[5] = 0x80;
        auVar61[6] = '\x03';
        auVar61[7] = 0x80;
        auVar61[0x10] = '\b';
        auVar61[0x11] = 0x80;
        auVar61[0x12] = '\t';
        auVar61[0x13] = 0x80;
        auVar61[0x14] = '\n';
        auVar61[0x15] = 0x80;
        auVar61[0x16] = '\v';
        auVar61[0x17] = 0x80;
        auVar61[0x18] = '\f';
        auVar61[0x19] = 0x80;
        auVar61[0x1a] = '\r';
        auVar61[0x1b] = 0x80;
        auVar61[0x1c] = '\x0e';
        auVar61[0x1d] = 0x80;
        auVar61[0x1e] = '\x0f';
        auVar61[0x1f] = 0x80;
        auVar23 = vpshufb_avx2(auVar62,auVar61);
        auVar60._16_8_ = uStack_3c10;
        auVar60._0_16_ = local_4580._0_16_;
        auVar60._24_8_ = local_4580._8_8_;
        auVar59[8] = '\x04';
        auVar59[9] = 0x80;
        auVar59[10] = '\x05';
        auVar59[0xb] = 0x80;
        auVar59[0xc] = '\x06';
        auVar59[0xd] = 0x80;
        auVar59[0xe] = '\a';
        auVar59[0xf] = 0x80;
        auVar59[0] = '\0';
        auVar59[1] = 0x80;
        auVar59[2] = '\x01';
        auVar59[3] = 0x80;
        auVar59[4] = '\x02';
        auVar59[5] = 0x80;
        auVar59[6] = '\x03';
        auVar59[7] = 0x80;
        auVar59[0x10] = '\b';
        auVar59[0x11] = 0x80;
        auVar59[0x12] = '\t';
        auVar59[0x13] = 0x80;
        auVar59[0x14] = '\n';
        auVar59[0x15] = 0x80;
        auVar59[0x16] = '\v';
        auVar59[0x17] = 0x80;
        auVar59[0x18] = '\f';
        auVar59[0x19] = 0x80;
        auVar59[0x1a] = '\r';
        auVar59[0x1b] = 0x80;
        auVar59[0x1c] = '\x0e';
        auVar59[0x1d] = 0x80;
        auVar59[0x1e] = '\x0f';
        auVar59[0x1f] = 0x80;
        auVar24 = vpshufb_avx2(auVar60,auVar59);
        auVar58._16_8_ = uStack_3c30;
        auVar58._0_16_ = local_45a0._0_16_;
        auVar58._24_8_ = local_45a0._8_8_;
        auVar57[8] = '\x04';
        auVar57[9] = 0x80;
        auVar57[10] = '\x05';
        auVar57[0xb] = 0x80;
        auVar57[0xc] = '\x06';
        auVar57[0xd] = 0x80;
        auVar57[0xe] = '\a';
        auVar57[0xf] = 0x80;
        auVar57[0] = '\0';
        auVar57[1] = 0x80;
        auVar57[2] = '\x01';
        auVar57[3] = 0x80;
        auVar57[4] = '\x02';
        auVar57[5] = 0x80;
        auVar57[6] = '\x03';
        auVar57[7] = 0x80;
        auVar57[0x10] = '\b';
        auVar57[0x11] = 0x80;
        auVar57[0x12] = '\t';
        auVar57[0x13] = 0x80;
        auVar57[0x14] = '\n';
        auVar57[0x15] = 0x80;
        auVar57[0x16] = '\v';
        auVar57[0x17] = 0x80;
        auVar57[0x18] = '\f';
        auVar57[0x19] = 0x80;
        auVar57[0x1a] = '\r';
        auVar57[0x1b] = 0x80;
        auVar57[0x1c] = '\x0e';
        auVar57[0x1d] = 0x80;
        auVar57[0x1e] = '\x0f';
        auVar57[0x1f] = 0x80;
        auVar25 = vpshufb_avx2(auVar58,auVar57);
        auVar56._16_8_ = uStack_3c70;
        auVar56._0_16_ = local_45e0._0_16_;
        auVar56._24_8_ = local_45e0._8_8_;
        auVar55[8] = '\x04';
        auVar55[9] = 0x80;
        auVar55[10] = '\x05';
        auVar55[0xb] = 0x80;
        auVar55[0xc] = '\x06';
        auVar55[0xd] = 0x80;
        auVar55[0xe] = '\a';
        auVar55[0xf] = 0x80;
        auVar55[0] = '\0';
        auVar55[1] = 0x80;
        auVar55[2] = '\x01';
        auVar55[3] = 0x80;
        auVar55[4] = '\x02';
        auVar55[5] = 0x80;
        auVar55[6] = '\x03';
        auVar55[7] = 0x80;
        auVar55[0x10] = '\b';
        auVar55[0x11] = 0x80;
        auVar55[0x12] = '\t';
        auVar55[0x13] = 0x80;
        auVar55[0x14] = '\n';
        auVar55[0x15] = 0x80;
        auVar55[0x16] = '\v';
        auVar55[0x17] = 0x80;
        auVar55[0x18] = '\f';
        auVar55[0x19] = 0x80;
        auVar55[0x1a] = '\r';
        auVar55[0x1b] = 0x80;
        auVar55[0x1c] = '\x0e';
        auVar55[0x1d] = 0x80;
        auVar55[0x1e] = '\x0f';
        auVar55[0x1f] = 0x80;
        auVar26 = vpshufb_avx2(auVar56,auVar55);
        auVar54._16_8_ = uStack_3cb0;
        auVar54._0_16_ = local_4620._0_16_;
        auVar54._24_8_ = local_4620._8_8_;
        auVar53[8] = '\x04';
        auVar53[9] = 0x80;
        auVar53[10] = '\x05';
        auVar53[0xb] = 0x80;
        auVar53[0xc] = '\x06';
        auVar53[0xd] = 0x80;
        auVar53[0xe] = '\a';
        auVar53[0xf] = 0x80;
        auVar53[0] = '\0';
        auVar53[1] = 0x80;
        auVar53[2] = '\x01';
        auVar53[3] = 0x80;
        auVar53[4] = '\x02';
        auVar53[5] = 0x80;
        auVar53[6] = '\x03';
        auVar53[7] = 0x80;
        auVar53[0x10] = '\b';
        auVar53[0x11] = 0x80;
        auVar53[0x12] = '\t';
        auVar53[0x13] = 0x80;
        auVar53[0x14] = '\n';
        auVar53[0x15] = 0x80;
        auVar53[0x16] = '\v';
        auVar53[0x17] = 0x80;
        auVar53[0x18] = '\f';
        auVar53[0x19] = 0x80;
        auVar53[0x1a] = '\r';
        auVar53[0x1b] = 0x80;
        auVar53[0x1c] = '\x0e';
        auVar53[0x1d] = 0x80;
        auVar53[0x1e] = '\x0f';
        auVar53[0x1f] = 0x80;
        auVar27 = vpshufb_avx2(auVar54,auVar53);
        auVar32 = vpaddw_avx2(auVar24,auVar15);
        auVar32 = vpaddw_avx2(auVar23,auVar32);
        auVar33 = vpaddw_avx2(auVar25,auVar22);
        auVar33 = vpaddw_avx2(auVar26,auVar33);
        auVar30 = vpaddw_avx2(auVar32,auVar30);
        auVar31 = vpaddw_avx2(auVar33,auVar31);
        auVar30 = vpaddw_avx2(auVar30,auVar18);
        auVar31 = vpaddw_avx2(auVar31,auVar19);
        auVar30 = vpaddw_avx2(auVar30,auVar31);
        auVar65._16_8_ = uStack_b0;
        auVar65._0_16_ = auVar3;
        auVar65._24_8_ = uStack_a8;
        auVar30 = vpaddw_avx2(auVar65,auVar30);
        auVar31 = vpaddw_avx2(auVar37,auVar17);
        auVar31 = vpaddw_avx2(auVar31,auVar30);
        auVar33 = vpsrlw_avx2(auVar31,ZEXT416(4));
        auVar32 = vpaddw_avx2(auVar27,auVar20);
        auVar32 = vpaddw_avx2(auVar32,auVar30);
        auVar30 = vpsrlw_avx2(auVar32,ZEXT416(4));
        auVar30 = vpackuswb_avx2(auVar33,auVar30);
        auVar30 = vpermq_avx2(auVar30,0xd8);
        auVar70._16_8_ = local_4710;
        auVar70._0_16_ = auVar5;
        auVar70._24_8_ = uStack_4708;
        auVar33 = vpandn_avx2(auVar70,auVar14);
        auVar78._16_8_ = local_4710;
        auVar78._0_16_ = auVar5;
        auVar78._24_8_ = uStack_4708;
        auVar30 = vpand_avx2(auVar78,auVar30);
        auVar30 = vpor_avx2(auVar30,auVar33);
        local_4400 = auVar30._0_8_;
        uStack_43f8 = auVar30._8_8_;
        uStack_43f0 = auVar30._16_8_;
        uStack_43e8 = auVar30._24_8_;
        *(undefined8 *)((long)in_RDI - (long)in_ESI) = local_4400;
        ((undefined8 *)((long)in_RDI - (long)in_ESI))[1] = uStack_43f8;
        *in_RDI = uStack_43f0;
        in_RDI[1] = uStack_43e8;
        auVar30 = vpsubw_avx2(auVar37,auVar26);
        auVar33 = vpsubw_avx2(auVar16,auVar19);
        auVar30 = vpaddw_avx2(auVar30,auVar33);
        auVar31 = vpaddw_avx2(auVar31,auVar30);
        auVar33 = vpsrlw_avx2(auVar31,ZEXT416(4));
        auVar30 = vpsubw_avx2(auVar27,auVar23);
        auVar14 = vpsubw_avx2(auVar21,auVar18);
        auVar30 = vpaddw_avx2(auVar30,auVar14);
        auVar32 = vpaddw_avx2(auVar32,auVar30);
        auVar30 = vpsrlw_avx2(auVar32,ZEXT416(4));
        auVar30 = vpackuswb_avx2(auVar33,auVar30);
        auVar30 = vpermq_avx2(auVar30,0xd8);
        auVar69._16_8_ = local_4710;
        auVar69._0_16_ = auVar5;
        auVar69._24_8_ = uStack_4708;
        auVar33 = vpandn_avx2(auVar69,auVar28);
        auVar77._16_8_ = local_4710;
        auVar77._0_16_ = auVar5;
        auVar77._24_8_ = uStack_4708;
        auVar30 = vpand_avx2(auVar77,auVar30);
        auVar30 = vpor_avx2(auVar30,auVar33);
        local_48a0 = auVar30._0_8_;
        uStack_4898 = auVar30._8_8_;
        uStack_4890 = auVar30._16_8_;
        uStack_4888 = auVar30._24_8_;
        puVar81 = (undefined8 *)((long)in_RDI - (long)(in_ESI * 2));
        *puVar81 = local_48a0;
        puVar81[1] = uStack_4898;
        *(undefined8 *)((long)in_RDI + (long)in_ESI) = uStack_4890;
        ((undefined8 *)((long)in_RDI + (long)in_ESI))[1] = uStack_4888;
        auVar30 = vpsubw_avx2(auVar37,auVar25);
        auVar33 = vpsubw_avx2(auVar15,auVar18);
        auVar30 = vpaddw_avx2(auVar30,auVar33);
        auVar31 = vpaddw_avx2(auVar31,auVar30);
        auVar33 = vpsrlw_avx2(auVar31,ZEXT416(4));
        auVar30 = vpsubw_avx2(auVar27,auVar24);
        auVar28 = vpsubw_avx2(auVar22,auVar19);
        auVar30 = vpaddw_avx2(auVar30,auVar28);
        auVar32 = vpaddw_avx2(auVar32,auVar30);
        auVar30 = vpsrlw_avx2(auVar32,ZEXT416(4));
        auVar30 = vpackuswb_avx2(auVar33,auVar30);
        auVar33 = vpermq_avx2(auVar30,0xd8);
        auVar68._16_8_ = local_4710;
        auVar68._0_16_ = auVar5;
        auVar68._24_8_ = uStack_4708;
        auVar30 = vpandn_avx2(auVar68,auVar29);
        auVar76._16_8_ = local_4710;
        auVar76._0_16_ = auVar5;
        auVar76._24_8_ = uStack_4708;
        auVar29 = vpand_avx2(auVar76,auVar33);
        auVar29 = vpor_avx2(auVar29,auVar30);
        local_4420 = auVar29._0_8_;
        uStack_4418 = auVar29._8_8_;
        uStack_4410 = auVar29._16_8_;
        uStack_4408 = auVar29._24_8_;
        puVar81 = (undefined8 *)((long)in_RDI - (long)(in_ESI * 3));
        *puVar81 = local_4420;
        puVar81[1] = uStack_4418;
        puVar81 = (undefined8 *)((long)in_RDI + (long)(in_ESI * 2));
        *puVar81 = uStack_4410;
        puVar81[1] = uStack_4408;
        auVar29 = vpsubw_avx2(auVar37,auVar22);
        auVar30 = vpsubw_avx2(auVar24,auVar17);
        auVar29 = vpaddw_avx2(auVar29,auVar30);
        auVar30 = vpaddw_avx2(auVar31,auVar29);
        auVar33 = vpsrlw_avx2(auVar30,ZEXT416(4));
        auVar29 = vpsubw_avx2(auVar27,auVar15);
        auVar31 = vpsubw_avx2(auVar25,auVar20);
        auVar29 = vpaddw_avx2(auVar29,auVar31);
        auVar31 = vpaddw_avx2(auVar32,auVar29);
        auVar29 = vpsrlw_avx2(auVar31,ZEXT416(4));
        auVar29 = vpackuswb_avx2(auVar33,auVar29);
        auVar29 = vpermq_avx2(auVar29,0xd8);
        auVar67._16_8_ = local_4710;
        auVar67._0_16_ = auVar5;
        auVar67._24_8_ = uStack_4708;
        auVar32 = vpandn_avx2(auVar67,auVar34);
        auVar75._16_8_ = local_4710;
        auVar75._0_16_ = auVar5;
        auVar75._24_8_ = uStack_4708;
        auVar29 = vpand_avx2(auVar75,auVar29);
        auVar29 = vpor_avx2(auVar29,auVar32);
        local_4440 = auVar29._0_8_;
        uStack_4438 = auVar29._8_8_;
        uStack_4430 = auVar29._16_8_;
        uStack_4428 = auVar29._24_8_;
        puVar81 = (undefined8 *)((long)in_RDI - (long)(in_ESI << 2));
        *puVar81 = local_4440;
        puVar81[1] = uStack_4438;
        puVar81 = (undefined8 *)((long)in_RDI + (long)(in_ESI * 3));
        *puVar81 = uStack_4430;
        puVar81[1] = uStack_4428;
        auVar29 = vpsubw_avx2(auVar37,auVar21);
        auVar32 = vpsubw_avx2(auVar23,auVar16);
        auVar29 = vpaddw_avx2(auVar29,auVar32);
        auVar30 = vpaddw_avx2(auVar30,auVar29);
        auVar32 = vpsrlw_avx2(auVar30,ZEXT416(4));
        auVar29 = vpsubw_avx2(auVar27,auVar16);
        auVar33 = vpsubw_avx2(auVar26,auVar21);
        auVar29 = vpaddw_avx2(auVar29,auVar33);
        auVar31 = vpaddw_avx2(auVar31,auVar29);
        auVar29 = vpsrlw_avx2(auVar31,ZEXT416(4));
        auVar29 = vpackuswb_avx2(auVar32,auVar29);
        auVar29 = vpermq_avx2(auVar29,0xd8);
        auVar66._16_8_ = local_4710;
        auVar66._0_16_ = auVar5;
        auVar66._24_8_ = uStack_4708;
        auVar32 = vpandn_avx2(auVar66,auVar35);
        auVar74._16_8_ = local_4710;
        auVar74._0_16_ = auVar5;
        auVar74._24_8_ = uStack_4708;
        auVar29 = vpand_avx2(auVar74,auVar29);
        auVar29 = vpor_avx2(auVar29,auVar32);
        puVar81 = (undefined8 *)((long)in_RDI - (long)(in_ESI * 5));
        local_4640 = auVar29._0_8_;
        uStack_4638 = auVar29._8_8_;
        *puVar81 = local_4640;
        puVar81[1] = uStack_4638;
        puVar81 = (undefined8 *)((long)in_RDI + (long)(in_ESI << 2));
        uStack_4630 = auVar29._16_8_;
        uStack_4628 = auVar29._24_8_;
        *puVar81 = uStack_4630;
        puVar81[1] = uStack_4628;
        auVar29 = vpsubw_avx2(auVar37,auVar20);
        auVar32 = vpsubw_avx2(auVar37,auVar15);
        auVar29 = vpaddw_avx2(auVar29,auVar32);
        auVar29 = vpaddw_avx2(auVar30,auVar29);
        auVar30 = vpsrlw_avx2(auVar29,ZEXT416(4));
        auVar29 = vpsubw_avx2(auVar27,auVar17);
        auVar32 = vpsubw_avx2(auVar27,auVar22);
        auVar29 = vpaddw_avx2(auVar29,auVar32);
        auVar29 = vpaddw_avx2(auVar31,auVar29);
        auVar29 = vpsrlw_avx2(auVar29,ZEXT416(4));
        auVar29 = vpackuswb_avx2(auVar30,auVar29);
        auVar29 = vpermq_avx2(auVar29,0xd8);
        auVar34._16_8_ = local_4710;
        auVar34._0_16_ = auVar5;
        auVar34._24_8_ = uStack_4708;
        auVar30 = vpandn_avx2(auVar34,auVar36);
        auVar35._16_8_ = local_4710;
        auVar35._0_16_ = auVar5;
        auVar35._24_8_ = uStack_4708;
        auVar29 = vpand_avx2(auVar35,auVar29);
        auVar29 = vpor_avx2(auVar29,auVar30);
        puVar81 = (undefined8 *)((long)in_RDI - (long)(in_ESI * 6));
        local_4660 = auVar29._0_8_;
        uStack_4658 = auVar29._8_8_;
        *puVar81 = local_4660;
        puVar81[1] = uStack_4658;
        puVar81 = (undefined8 *)((long)in_RDI + (long)(in_ESI * 5));
        uStack_4650 = auVar29._16_8_;
        uStack_4648 = auVar29._24_8_;
        *puVar81 = uStack_4650;
        puVar81[1] = uStack_4648;
      }
    }
  }
  return;
}

Assistant:

void aom_lpf_horizontal_14_quad_avx2(unsigned char *s, int p,
                                     const unsigned char *_blimit0,
                                     const unsigned char *_limit0,
                                     const unsigned char *_thresh0) {
  __m128i mask, flat;
  const __m128i zero = _mm_setzero_si128();
  const __m128i ff = _mm_cmpeq_epi8(zero, zero);

  __m256i p256_3 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s - 4 * p)));
  __m256i p256_2 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s - 3 * p)));
  __m256i p256_1 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s - 2 * p)));
  __m256i p256_0 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s - 1 * p)));
  __m256i q256_0 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s - 0 * p)));
  __m256i q256_1 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s + 1 * p)));
  __m256i q256_2 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s + 2 * p)));
  __m256i q256_3 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s + 3 * p)));

  __m128i p3 = _mm256_castsi256_si128(p256_3);
  __m128i p2 = _mm256_castsi256_si128(p256_2);
  __m128i p1 = _mm256_castsi256_si128(p256_1);
  __m128i p0 = _mm256_castsi256_si128(p256_0);
  __m128i q0 = _mm256_castsi256_si128(q256_0);
  __m128i q1 = _mm256_castsi256_si128(q256_1);
  __m128i q2 = _mm256_castsi256_si128(q256_2);
  __m128i q3 = _mm256_castsi256_si128(q256_3);

  {
    const __m128i limit_v =
        _mm_broadcastb_epi8(_mm_cvtsi32_si128((int)_limit0[0]));
    const __m128i blimit_v =
        _mm_broadcastb_epi8(_mm_cvtsi32_si128((int)_blimit0[0]));
    const __m128i fe = _mm_set1_epi8((int8_t)0xfe);
    const __m128i abs_p1p0 =
        _mm_or_si128(_mm_subs_epu8(p1, p0), _mm_subs_epu8(p0, p1));
    const __m128i abs_q1q0 =
        _mm_or_si128(_mm_subs_epu8(q1, q0), _mm_subs_epu8(q0, q1));
    __m128i abs_p0q0 =
        _mm_or_si128(_mm_subs_epu8(p0, q0), _mm_subs_epu8(q0, p0));
    __m128i abs_p1q1 =
        _mm_or_si128(_mm_subs_epu8(p1, q1), _mm_subs_epu8(q1, p1));

    flat = _mm_max_epu8(abs_p1p0, abs_q1q0);

    abs_p0q0 = _mm_adds_epu8(abs_p0q0, abs_p0q0);
    abs_p1q1 = _mm_srli_epi16(_mm_and_si128(abs_p1q1, fe), 1);
    mask = _mm_subs_epu8(_mm_adds_epu8(abs_p0q0, abs_p1q1), blimit_v);
    mask = _mm_xor_si128(_mm_cmpeq_epi8(mask, zero), ff);
    // mask |= (abs(p0 - q0) * 2 + abs(p1 - q1) / 2  > blimit) * -1;
    mask = _mm_max_epu8(flat, mask);
    // mask |= (abs(p1 - p0) > limit) * -1;
    // mask |= (abs(q1 - q0) > limit) * -1;
    __m128i work = _mm_max_epu8(
        _mm_or_si128(_mm_subs_epu8(p2, p1), _mm_subs_epu8(p1, p2)),
        _mm_or_si128(_mm_subs_epu8(p3, p2), _mm_subs_epu8(p2, p3)));
    mask = _mm_max_epu8(work, mask);
    work = _mm_max_epu8(
        _mm_or_si128(_mm_subs_epu8(q2, q1), _mm_subs_epu8(q1, q2)),
        _mm_or_si128(_mm_subs_epu8(q3, q2), _mm_subs_epu8(q2, q3)));
    mask = _mm_max_epu8(work, mask);
    mask = _mm_subs_epu8(mask, limit_v);
    mask = _mm_cmpeq_epi8(mask, zero);
  }

  if (0xffff == _mm_movemask_epi8(_mm_cmpeq_epi8(mask, zero))) return;

  // loop filter
  {
    const __m128i thresh_v =
        _mm_broadcastb_epi8(_mm_cvtsi32_si128((int)_thresh0[0]));
    const __m128i one = _mm_set1_epi8(1);
    const __m128i t3 = _mm_set1_epi8(3);
    const __m128i t4 = _mm_add_epi8(one, t3);
    const __m128i t80 = _mm_set1_epi8((int8_t)0x80);
    const __m128i te0 = _mm_set1_epi8((int8_t)0xe0);
    const __m128i t1f = _mm_set1_epi8(0x1f);
    const __m128i t7f = _mm_sub_epi8(t80, one);

    __m128i hev = _mm_subs_epu8(flat, thresh_v);
    hev = _mm_xor_si128(_mm_cmpeq_epi8(hev, zero), ff);

    __m128i ps1 = _mm_xor_si128(p1, t80);
    __m128i ps0 = _mm_xor_si128(p0, t80);
    __m128i qs0 = _mm_xor_si128(q0, t80);
    __m128i qs1 = _mm_xor_si128(q1, t80);

    __m128i filt = _mm_and_si128(_mm_subs_epi8(ps1, qs1), hev);
    __m128i work_a = _mm_subs_epi8(qs0, ps0);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_and_si128(filt, mask);

    __m128i filter1 = _mm_adds_epi8(filt, t4);
    __m128i filter2 = _mm_adds_epi8(filt, t3);

    work_a = _mm_cmpgt_epi8(zero, filter1);
    filter1 = _mm_srli_epi16(filter1, 3);
    work_a = _mm_and_si128(work_a, te0);
    filter1 = _mm_and_si128(filter1, t1f);
    filter1 = _mm_or_si128(filter1, work_a);
    qs0 = _mm_xor_si128(_mm_subs_epi8(qs0, filter1), t80);

    work_a = _mm_cmpgt_epi8(zero, filter2);
    filter2 = _mm_srli_epi16(filter2, 3);
    work_a = _mm_and_si128(work_a, te0);
    filter2 = _mm_and_si128(filter2, t1f);
    filter2 = _mm_or_si128(filter2, work_a);
    ps0 = _mm_xor_si128(_mm_adds_epi8(ps0, filter2), t80);

    filt = _mm_adds_epi8(filter1, one);
    work_a = _mm_cmpgt_epi8(zero, filt);
    filt = _mm_srli_epi16(filt, 1);
    work_a = _mm_and_si128(work_a, t80);
    filt = _mm_and_si128(filt, t7f);
    filt = _mm_or_si128(filt, work_a);
    filt = _mm_andnot_si128(hev, filt);
    ps1 = _mm_xor_si128(_mm_adds_epi8(ps1, filt), t80);
    qs1 = _mm_xor_si128(_mm_subs_epi8(qs1, filt), t80);

    // Derive flat
    __m256i p0q0256 = _mm256_blend_epi32(p256_0, q256_0, 0xf0);
    __m256i p2q2256 = _mm256_blend_epi32(p256_2, q256_2, 0xf0);
    __m256i p3q3256 = _mm256_blend_epi32(p256_3, q256_3, 0xf0);
    const __m256i ps0qs0256 =
        _mm256_insertf128_si256(_mm256_castsi128_si256(ps0), qs0, 0x1);
    const __m256i ps1qs1256 =
        _mm256_insertf128_si256(_mm256_castsi128_si256(ps1), qs1, 0x1);
    const __m256i work01 = _mm256_or_si256(_mm256_subs_epu8(p2q2256, p0q0256),
                                           _mm256_subs_epu8(p0q0256, p2q2256));
    const __m256i work02 = _mm256_or_si256(_mm256_subs_epu8(p3q3256, p0q0256),
                                           _mm256_subs_epu8(p0q0256, p3q3256));
    const __m256i max0_256 = _mm256_max_epu8(work01, work02);
    const __m128i max1_256 =
        _mm_max_epu8(_mm256_castsi256_si128(max0_256),
                     _mm256_extractf128_si256(max0_256, 1));
    flat = _mm_max_epu8(max1_256, flat);
    flat = _mm_subs_epu8(flat, one);
    flat = _mm_cmpeq_epi8(flat, zero);
    flat = _mm_and_si128(flat, mask);

    // ~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~
    // flat and wide flat calculations
    if (0xffff != _mm_movemask_epi8(_mm_cmpeq_epi8(flat, zero))) {
      const __m256i flat256 =
          _mm256_insertf128_si256(_mm256_castsi128_si256(flat), flat, 0x1);
      const __m256i eight = _mm256_set1_epi16(8);
      const __m256i four = _mm256_set1_epi16(4);

      __m256i p256_4 = _mm256_castpd_si256(
          _mm256_broadcast_pd((__m128d const *)(s - 5 * p)));
      __m256i q256_4 = _mm256_castpd_si256(
          _mm256_broadcast_pd((__m128d const *)(s + 4 * p)));
      __m256i p256_5 = _mm256_castpd_si256(
          _mm256_broadcast_pd((__m128d const *)(s - 6 * p)));
      __m256i q256_5 = _mm256_castpd_si256(
          _mm256_broadcast_pd((__m128d const *)(s + 5 * p)));
      __m256i p256_6 = _mm256_castpd_si256(
          _mm256_broadcast_pd((__m128d const *)(s - 7 * p)));
      __m256i q256_6 = _mm256_castpd_si256(
          _mm256_broadcast_pd((__m128d const *)(s + 6 * p)));

      // Derive flat2
      __m256i p4q4256 = _mm256_blend_epi32(p256_4, q256_4, 0xf0);
      __m256i p5q5256 = _mm256_blend_epi32(p256_5, q256_5, 0xf0);
      const __m256i p6q6256 = _mm256_blend_epi32(p256_6, q256_6, 0xf0);
      const __m256i work1 = _mm256_or_si256(_mm256_subs_epu8(p4q4256, p0q0256),
                                            _mm256_subs_epu8(p0q0256, p4q4256));
      const __m256i work2 = _mm256_or_si256(_mm256_subs_epu8(p5q5256, p0q0256),
                                            _mm256_subs_epu8(p0q0256, p5q5256));
      const __m256i work3 = _mm256_or_si256(_mm256_subs_epu8(p6q6256, p0q0256),
                                            _mm256_subs_epu8(p0q0256, p6q6256));
      __m256i flat2_256 = _mm256_max_epu8(work1, work2);
      flat2_256 = _mm256_max_epu8(flat2_256, work3);
      __m128i flat2 = _mm_max_epu8(_mm256_castsi256_si128(flat2_256),
                                   _mm256_extractf128_si256(flat2_256, 1));
      flat2 = _mm_subs_epu8(flat2, one);
      flat2 = _mm_cmpeq_epi8(flat2, zero);
      flat2 = _mm_and_si128(flat2, flat);  // flat2 & flat & mask

      const __m256i filter =
          _mm256_load_si256((__m256i const *)filt_loopfilter_avx2);

      p256_3 = _mm256_shuffle_epi8(p256_3, filter);
      p256_2 = _mm256_shuffle_epi8(p256_2, filter);
      p256_1 = _mm256_shuffle_epi8(p256_1, filter);
      p256_0 = _mm256_shuffle_epi8(p256_0, filter);
      q256_0 = _mm256_shuffle_epi8(q256_0, filter);
      q256_1 = _mm256_shuffle_epi8(q256_1, filter);
      q256_2 = _mm256_shuffle_epi8(q256_2, filter);
      q256_3 = _mm256_shuffle_epi8(q256_3, filter);

      const __m256i p2p1p0 =
          _mm256_add_epi16(p256_0, _mm256_add_epi16(p256_2, p256_1));
      const __m256i q2q1q0 =
          _mm256_add_epi16(q256_0, _mm256_add_epi16(q256_2, q256_1));

      __m256i pixetFilter_p2p1p0 =
          _mm256_add_epi16(four, _mm256_add_epi16(p2p1p0, q2q1q0));
      __m256i pixetFilter_q2q1q0 = pixetFilter_p2p1p0;

      // Derive p0 and q0
      pixetFilter_p2p1p0 = _mm256_add_epi16(pixetFilter_p2p1p0, p256_3);
      __m256i res_p =
          _mm256_srli_epi16(_mm256_add_epi16(pixetFilter_p2p1p0, p256_0), 3);
      pixetFilter_q2q1q0 = _mm256_add_epi16(pixetFilter_q2q1q0, q256_3);
      __m256i res_q =
          _mm256_srli_epi16(_mm256_add_epi16(pixetFilter_q2q1q0, q256_0), 3);
      __m256i flat_p0q0 =
          _mm256_permute4x64_epi64(_mm256_packus_epi16(res_p, res_q), 0xd8);
      p0q0256 = _mm256_andnot_si256(flat256, ps0qs0256);
      flat_p0q0 = _mm256_and_si256(flat256, flat_p0q0);
      p0q0256 = _mm256_or_si256(flat_p0q0, p0q0256);
      p0 = _mm256_castsi256_si128(p0q0256);
      q0 = _mm256_extractf128_si256(p0q0256, 1);

      // Derive p1 and q1
      __m256i sum_p = _mm256_sub_epi16(p256_3, q256_2);
      pixetFilter_p2p1p0 = _mm256_add_epi16(pixetFilter_p2p1p0, sum_p);
      res_p =
          _mm256_srli_epi16(_mm256_add_epi16(pixetFilter_p2p1p0, p256_1), 3);
      __m256i sum_q = _mm256_sub_epi16(q256_3, p256_2);
      pixetFilter_q2q1q0 = _mm256_add_epi16(pixetFilter_q2q1q0, sum_q);
      res_q =
          _mm256_srli_epi16(_mm256_add_epi16(pixetFilter_q2q1q0, q256_1), 3);
      __m256i flat_p1q1 =
          _mm256_permute4x64_epi64(_mm256_packus_epi16(res_p, res_q), 0xd8);
      __m256i p1q1256 = _mm256_andnot_si256(flat256, ps1qs1256);
      flat_p1q1 = _mm256_and_si256(flat256, flat_p1q1);
      p1q1256 = _mm256_or_si256(flat_p1q1, p1q1256);
      p1 = _mm256_castsi256_si128(p1q1256);
      q1 = _mm256_extractf128_si256(p1q1256, 1);

      // Derive p2 and q2
      sum_p = _mm256_sub_epi16(p256_3, q256_1);
      pixetFilter_p2p1p0 = _mm256_add_epi16(pixetFilter_p2p1p0, sum_p);
      res_p =
          _mm256_srli_epi16(_mm256_add_epi16(pixetFilter_p2p1p0, p256_2), 3);
      sum_q = _mm256_sub_epi16(q256_3, p256_1);
      pixetFilter_q2q1q0 = _mm256_add_epi16(pixetFilter_q2q1q0, sum_q);
      res_q =
          _mm256_srli_epi16(_mm256_add_epi16(pixetFilter_q2q1q0, q256_2), 3);
      __m256i flat_p2q2 =
          _mm256_permute4x64_epi64(_mm256_packus_epi16(res_p, res_q), 0xd8);
      p2q2256 = _mm256_andnot_si256(flat256, p2q2256);
      flat_p2q2 = _mm256_and_si256(flat256, flat_p2q2);
      p2q2256 = _mm256_or_si256(flat_p2q2, p2q2256);
      p2 = _mm256_castsi256_si128(p2q2256);
      q2 = _mm256_extractf128_si256(p2q2256, 1);
      if (0xffff != _mm_movemask_epi8(_mm_cmpeq_epi8(flat2, zero))) {
        flat2_256 =
            _mm256_insertf128_si256(_mm256_castsi128_si256(flat2), flat2, 0x1);
        p256_6 = _mm256_shuffle_epi8(p256_6, filter);
        p256_5 = _mm256_shuffle_epi8(p256_5, filter);
        p256_4 = _mm256_shuffle_epi8(p256_4, filter);
        q256_4 = _mm256_shuffle_epi8(q256_4, filter);
        q256_5 = _mm256_shuffle_epi8(q256_5, filter);
        q256_6 = _mm256_shuffle_epi8(q256_6, filter);

        __m256i pixelFilter_p =
            _mm256_add_epi16(p256_5, _mm256_add_epi16(p256_4, p256_3));
        __m256i pixelFilter_q =
            _mm256_add_epi16(q256_5, _mm256_add_epi16(q256_4, q256_3));

        pixelFilter_p = _mm256_add_epi16(pixelFilter_p, p2p1p0);
        pixelFilter_q = _mm256_add_epi16(pixelFilter_q, q2q1q0);

        pixelFilter_p = _mm256_add_epi16(pixelFilter_p, p256_0);
        pixelFilter_q = _mm256_add_epi16(pixelFilter_q, q256_0);
        pixelFilter_p = _mm256_add_epi16(
            eight, _mm256_add_epi16(pixelFilter_p, pixelFilter_q));
        pixelFilter_q = pixelFilter_p;

        // Derive p0 and q0
        pixelFilter_p =
            _mm256_add_epi16(_mm256_add_epi16(p256_6, p256_1), pixelFilter_p);
        res_p = _mm256_srli_epi16(pixelFilter_p, 4);
        pixelFilter_q =
            _mm256_add_epi16(_mm256_add_epi16(q256_6, q256_1), pixelFilter_q);
        res_q = _mm256_srli_epi16(pixelFilter_q, 4);
        __m256i flat2_p0q0 =
            _mm256_permute4x64_epi64(_mm256_packus_epi16(res_p, res_q), 0xd8);
        p0q0256 = _mm256_andnot_si256(flat2_256, p0q0256);
        flat2_p0q0 = _mm256_and_si256(flat2_256, flat2_p0q0);
        p0q0256 = _mm256_or_si256(flat2_p0q0, p0q0256);

        p0 = _mm256_castsi256_si128(p0q0256);
        q0 = _mm256_extractf128_si256(p0q0256, 1);
        _mm_storeu_si128((__m128i *)(s - 1 * p), p0);
        _mm_storeu_si128((__m128i *)(s - 0 * p), q0);

        // Derive p1 and q1
        sum_p = _mm256_add_epi16(_mm256_sub_epi16(p256_6, q256_5),
                                 _mm256_sub_epi16(p256_2, q256_0));
        pixelFilter_p = _mm256_add_epi16(pixelFilter_p, sum_p);
        res_p = _mm256_srli_epi16(pixelFilter_p, 4);
        sum_q = _mm256_add_epi16(_mm256_sub_epi16(q256_6, p256_5),
                                 _mm256_sub_epi16(q256_2, p256_0));
        pixelFilter_q = _mm256_add_epi16(pixelFilter_q, sum_q);
        res_q = _mm256_srli_epi16(pixelFilter_q, 4);
        __m256i flat2_p1q1 =
            _mm256_permute4x64_epi64(_mm256_packus_epi16(res_p, res_q), 0xd8);
        p1q1256 = _mm256_andnot_si256(flat2_256, p1q1256);
        flat2_p1q1 = _mm256_and_si256(flat2_256, flat2_p1q1);
        p1q1256 = _mm256_or_si256(flat2_p1q1, p1q1256);
        p1 = _mm256_castsi256_si128(p1q1256);
        q1 = _mm256_extractf128_si256(p1q1256, 1);
        _mm_storeu_si128((__m128i *)(s - 2 * p), p1);
        _mm_storeu_si128((__m128i *)(s + 1 * p), q1);

        // Derive p2 and q2
        sum_p = _mm256_add_epi16(_mm256_sub_epi16(p256_6, q256_4),
                                 _mm256_sub_epi16(p256_3, p256_0));
        pixelFilter_p = _mm256_add_epi16(pixelFilter_p, sum_p);
        res_p = _mm256_srli_epi16(pixelFilter_p, 4);
        sum_q = _mm256_add_epi16(_mm256_sub_epi16(q256_6, p256_4),
                                 _mm256_sub_epi16(q256_3, q256_0));
        pixelFilter_q = _mm256_add_epi16(pixelFilter_q, sum_q);
        res_q = _mm256_srli_epi16(pixelFilter_q, 4);
        __m256i flat2_p2q2 =
            _mm256_permute4x64_epi64(_mm256_packus_epi16(res_p, res_q), 0xd8);
        p2q2256 = _mm256_andnot_si256(flat2_256, p2q2256);
        flat2_p2q2 = _mm256_and_si256(flat2_256, flat2_p2q2);
        p2q2256 = _mm256_or_si256(flat2_p2q2, p2q2256);
        p2 = _mm256_castsi256_si128(p2q2256);
        q2 = _mm256_extractf128_si256(p2q2256, 1);
        _mm_storeu_si128((__m128i *)(s - 3 * p), p2);
        _mm_storeu_si128((__m128i *)(s + 2 * p), q2);

        // Derive p3 and q3
        sum_p = _mm256_add_epi16(_mm256_sub_epi16(p256_6, q256_3),
                                 _mm256_sub_epi16(p256_4, p256_1));
        pixelFilter_p = _mm256_add_epi16(pixelFilter_p, sum_p);
        res_p = _mm256_srli_epi16(pixelFilter_p, 4);
        sum_q = _mm256_add_epi16(_mm256_sub_epi16(q256_6, p256_3),
                                 _mm256_sub_epi16(q256_4, q256_1));
        pixelFilter_q = _mm256_add_epi16(pixelFilter_q, sum_q);
        res_q = _mm256_srli_epi16(pixelFilter_q, 4);
        __m256i flat2_p3q3 =
            _mm256_permute4x64_epi64(_mm256_packus_epi16(res_p, res_q), 0xd8);
        p3q3256 = _mm256_andnot_si256(flat2_256, p3q3256);
        flat2_p3q3 = _mm256_and_si256(flat2_256, flat2_p3q3);
        p3q3256 = _mm256_or_si256(flat2_p3q3, p3q3256);
        p3 = _mm256_castsi256_si128(p3q3256);
        q3 = _mm256_extractf128_si256(p3q3256, 1);
        _mm_storeu_si128((__m128i *)(s - 4 * p), p3);
        _mm_storeu_si128((__m128i *)(s + 3 * p), q3);

        // Derive p4 and q4
        sum_p = _mm256_add_epi16(_mm256_sub_epi16(p256_6, q256_2),
                                 _mm256_sub_epi16(p256_5, p256_2));
        pixelFilter_p = _mm256_add_epi16(pixelFilter_p, sum_p);
        res_p = _mm256_srli_epi16(pixelFilter_p, 4);
        sum_q = _mm256_add_epi16(_mm256_sub_epi16(q256_6, p256_2),
                                 _mm256_sub_epi16(q256_5, q256_2));
        pixelFilter_q = _mm256_add_epi16(pixelFilter_q, sum_q);
        res_q = _mm256_srli_epi16(pixelFilter_q, 4);
        __m256i flat2_p4q4 =
            _mm256_permute4x64_epi64(_mm256_packus_epi16(res_p, res_q), 0xd8);
        p4q4256 = _mm256_andnot_si256(flat2_256, p4q4256);
        flat2_p4q4 = _mm256_and_si256(flat2_256, flat2_p4q4);
        p4q4256 = _mm256_or_si256(flat2_p4q4, p4q4256);
        _mm_storeu_si128((__m128i *)(s - 5 * p),
                         _mm256_castsi256_si128(p4q4256));
        _mm_storeu_si128((__m128i *)(s + 4 * p),
                         _mm256_extractf128_si256(p4q4256, 1));

        // Derive p5 and q5
        sum_p = _mm256_add_epi16(_mm256_sub_epi16(p256_6, q256_1),
                                 _mm256_sub_epi16(p256_6, p256_3));
        pixelFilter_p = _mm256_add_epi16(pixelFilter_p, sum_p);
        res_p = _mm256_srli_epi16(pixelFilter_p, 4);
        sum_q = _mm256_add_epi16(_mm256_sub_epi16(q256_6, p256_1),
                                 _mm256_sub_epi16(q256_6, q256_3));
        pixelFilter_q = _mm256_add_epi16(pixelFilter_q, sum_q);
        res_q = _mm256_srli_epi16(pixelFilter_q, 4);
        __m256i flat2_p5q5 =
            _mm256_permute4x64_epi64(_mm256_packus_epi16(res_p, res_q), 0xd8);
        p5q5256 = _mm256_andnot_si256(flat2_256, p5q5256);
        flat2_p5q5 = _mm256_and_si256(flat2_256, flat2_p5q5);
        p5q5256 = _mm256_or_si256(flat2_p5q5, p5q5256);
        _mm_storeu_si128((__m128i *)(s - 6 * p),
                         _mm256_castsi256_si128(p5q5256));
        _mm_storeu_si128((__m128i *)(s + 5 * p),
                         _mm256_extractf128_si256(p5q5256, 1));
      } else {
        _mm_storeu_si128((__m128i *)(s - 3 * p), p2);
        _mm_storeu_si128((__m128i *)(s - 2 * p), p1);
        _mm_storeu_si128((__m128i *)(s - 1 * p), p0);
        _mm_storeu_si128((__m128i *)(s - 0 * p), q0);
        _mm_storeu_si128((__m128i *)(s + 1 * p), q1);
        _mm_storeu_si128((__m128i *)(s + 2 * p), q2);
      }
    } else {
      _mm_storeu_si128((__m128i *)(s - 2 * p), ps1);
      _mm_storeu_si128((__m128i *)(s - 1 * p), ps0);
      _mm_storeu_si128((__m128i *)(s - 0 * p), qs0);
      _mm_storeu_si128((__m128i *)(s + 1 * p), qs1);
    }
  }
}